

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEmbedTest.cpp
# Opt level: O0

int PDFEmbedTest(int argc,char **argv)

{
  PageContentContext *pPVar1;
  LogConfiguration *inLogConfiguration;
  EncryptionOptions *pEVar2;
  PDFParsingOptions *inParsingOptions;
  PDFPage *this;
  ResourcesDictionary *pRVar3;
  reference pvVar4;
  bool bVar5;
  string local_10f0;
  string local_10d0;
  PageContentContext *local_10b0;
  PageContentContext *contentContext;
  PDFPage *local_1088;
  PDFPage *page;
  list<unsigned_long,_std::allocator<unsigned_long>_> local_1078;
  PDFPageRange local_1060;
  allocator<char> local_1039;
  string local_1038;
  string local_1018;
  undefined1 local_ff8 [8];
  EStatusCodeAndObjectIDTypeList result;
  PDFCreationSettings local_f88;
  allocator<char> local_f11;
  string local_f10;
  string local_ef0;
  undefined1 local_ed0 [8];
  PDFWriter pdfWriter;
  EStatusCode status;
  char **argv_local;
  int argc_local;
  
  PDFWriter::PDFWriter((PDFWriter *)local_ed0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f10,"PDFEmbedTest.pdf",&local_f11);
  BuildRelativeOutputPath(&local_ef0,argv,&local_f10);
  inLogConfiguration = LogConfiguration::DefaultLogConfiguration();
  pEVar2 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions
            ((EncryptionOptions *)
             &result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              _M_node._M_size,pEVar2);
  PDFCreationSettings::PDFCreationSettings
            (&local_f88,true,true,
             (EncryptionOptions *)
             &result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              _M_node._M_size,false);
  pdfWriter._3756_4_ =
       PDFWriter::StartPDF((PDFWriter *)local_ed0,&local_ef0,ePDFVersion13,inLogConfiguration,
                           &local_f88);
  PDFCreationSettings::~PDFCreationSettings(&local_f88);
  EncryptionOptions::~EncryptionOptions
            ((EncryptionOptions *)
             &result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              _M_node._M_size);
  std::__cxx11::string::~string((string *)&local_ef0);
  std::__cxx11::string::~string((string *)&local_f10);
  std::allocator<char>::~allocator(&local_f11);
  if (pdfWriter._3756_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1038,"XObjectContent.pdf",&local_1039);
    BuildRelativeInputPath(&local_1018,argv,&local_1038);
    PDFPageRange::PDFPageRange(&local_1060);
    local_1078.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
    local_1078.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_1078.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    _M_size = 0;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list(&local_1078);
    inParsingOptions = PDFParsingOptions::DefaultPDFParsingOptions();
    PDFWriter::CreateFormXObjectsFromPDF
              ((EStatusCodeAndObjectIDTypeList *)local_ff8,(PDFWriter *)local_ed0,&local_1018,
               &local_1060,ePDFPageBoxMediaBox,(double *)0x0,&local_1078,inParsingOptions);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list(&local_1078);
    PDFPageRange::~PDFPageRange(&local_1060);
    std::__cxx11::string::~string((string *)&local_1018);
    std::__cxx11::string::~string((string *)&local_1038);
    std::allocator<char>::~allocator(&local_1039);
    if (local_ff8._0_4_ == eSuccess) {
      this = (PDFPage *)operator_new(0x2b8);
      PDFPage::PDFPage(this);
      local_1088 = this;
      PDFRectangle::PDFRectangle((PDFRectangle *)&contentContext,0.0,0.0,595.0,842.0);
      PDFPage::SetMediaBox(this,(PDFRectangle *)&contentContext);
      PDFRectangle::~PDFRectangle((PDFRectangle *)&contentContext);
      local_10b0 = PDFWriter::StartPageContentContext((PDFWriter *)local_ed0,local_1088);
      AbstractContentContext::q(&local_10b0->super_AbstractContentContext);
      AbstractContentContext::cm
                (&local_10b0->super_AbstractContentContext,0.5,0.0,0.0,0.5,0.0,421.0);
      pPVar1 = local_10b0;
      pRVar3 = PDFPage::GetResourcesDictionary(local_1088);
      pvVar4 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::front
                         ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&result);
      ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_(&local_10d0,pRVar3,*pvVar4);
      AbstractContentContext::Do(&pPVar1->super_AbstractContentContext,&local_10d0);
      std::__cxx11::string::~string((string *)&local_10d0);
      AbstractContentContext::Q(&local_10b0->super_AbstractContentContext);
      AbstractContentContext::G(&local_10b0->super_AbstractContentContext,0.0);
      AbstractContentContext::w(&local_10b0->super_AbstractContentContext,1.0);
      AbstractContentContext::re(&local_10b0->super_AbstractContentContext,0.0,421.0,297.5,421.0);
      AbstractContentContext::S(&local_10b0->super_AbstractContentContext);
      AbstractContentContext::q(&local_10b0->super_AbstractContentContext);
      AbstractContentContext::cm
                (&local_10b0->super_AbstractContentContext,0.5,0.0,0.0,0.5,297.5,0.0);
      pPVar1 = local_10b0;
      pRVar3 = PDFPage::GetResourcesDictionary(local_1088);
      pvVar4 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::back
                         ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&result);
      ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_(&local_10f0,pRVar3,*pvVar4);
      AbstractContentContext::Do(&pPVar1->super_AbstractContentContext,&local_10f0);
      std::__cxx11::string::~string((string *)&local_10f0);
      AbstractContentContext::Q(&local_10b0->super_AbstractContentContext);
      AbstractContentContext::G(&local_10b0->super_AbstractContentContext,0.0);
      AbstractContentContext::w(&local_10b0->super_AbstractContentContext,1.0);
      AbstractContentContext::re(&local_10b0->super_AbstractContentContext,297.5,0.0,297.5,421.0);
      AbstractContentContext::S(&local_10b0->super_AbstractContentContext);
      pdfWriter._3756_4_ = PDFWriter::EndPageContentContext((PDFWriter *)local_ed0,local_10b0);
      if (pdfWriter._3756_4_ == eSuccess) {
        pdfWriter._3756_4_ = PDFWriter::WritePageAndRelease((PDFWriter *)local_ed0,local_1088);
        if (pdfWriter._3756_4_ == eSuccess) {
          pdfWriter._3756_4_ = PDFWriter::EndPDF((PDFWriter *)local_ed0);
          if (pdfWriter._3756_4_ == eSuccess) {
            page._4_4_ = 0;
          }
          else {
            std::operator<<((ostream *)&std::cout,"failed in end PDF\n");
            page._4_4_ = 2;
          }
        }
        else {
          std::operator<<((ostream *)&std::cout,"failed to write page\n");
          page._4_4_ = 2;
        }
      }
      else {
        std::operator<<((ostream *)&std::cout,"failed to end page content context\n");
        page._4_4_ = 2;
      }
    }
    else {
      std::operator<<((ostream *)&std::cout,"failed to create PDF XObjects from PDF file\n");
      pdfWriter._3756_4_ = local_ff8._0_4_;
      page._4_4_ = 2;
    }
    std::
    pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::~pair((pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
             *)local_ff8);
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to start PDF\n");
  }
  bVar5 = pdfWriter._3756_4_ != 0;
  page._4_4_ = 1;
  PDFWriter::~PDFWriter((PDFWriter *)local_ed0);
  return (uint)bVar5;
}

Assistant:

int PDFEmbedTest(int argc, char* argv[])
{
	EStatusCode status;
	PDFWriter pdfWriter;

	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv,"PDFEmbedTest.pdf"),ePDFVersion13);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start PDF\n";
			break;
		}	

		// Create XObjects from PDF to embed
		EStatusCodeAndObjectIDTypeList result = pdfWriter.CreateFormXObjectsFromPDF(
                                                        BuildRelativeInputPath(argv,"XObjectContent.pdf"),PDFPageRange(),ePDFPageBoxMediaBox);
		if(result.first != PDFHummus::eSuccess)
		{
			cout<<"failed to create PDF XObjects from PDF file\n";
			status = result.first;
			break;
		}

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));

		PageContentContext* contentContext = pdfWriter.StartPageContentContext(page);

		// place the first page in the top left corner of the document
		contentContext->q();
		contentContext->cm(0.5,0,0,0.5,0,421);
		contentContext->Do(page->GetResourcesDictionary().AddFormXObjectMapping(result.second.front()));
		contentContext->Q();
		
		contentContext->G(0);
		contentContext->w(1);
		contentContext->re(0,421,297.5,421);
		contentContext->S();


		// place the second page in the bottom right corner of the document
		contentContext->q();
		contentContext->cm(0.5,0,0,0.5,297.5,0);
		contentContext->Do(page->GetResourcesDictionary().AddFormXObjectMapping(result.second.back()));
		contentContext->Q();

		contentContext->G(0);
		contentContext->w(1);
		contentContext->re(297.5,0,297.5,421);
		contentContext->S();


		status = pdfWriter.EndPageContentContext(contentContext);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to end page content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to write page\n";
			break;
		}

		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end PDF\n";
			break;
		}

	}while(false);

	return status == eSuccess ? 0:1;
}